

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

Matrix4x4 * __thiscall CS248::DynamicScene::SceneObject::getRotation(SceneObject *this)

{
  Vector3D *in_RDI;
  Vector3D rot;
  Vector3D *this_00;
  Matrix4x4 *in_stack_fffffffffffffdd0;
  Matrix4x4 *in_stack_fffffffffffffdd8;
  Axis in_stack_fffffffffffffe04;
  double in_stack_fffffffffffffe08;
  
  this_00 = in_RDI;
  Vector3D::operator*(in_RDI,&in_RDI->x);
  Vector3D::operator/(this_00,&in_RDI->x);
  Matrix4x4::rotation(in_stack_fffffffffffffe08,in_stack_fffffffffffffe04);
  Matrix4x4::rotation(in_stack_fffffffffffffe08,in_stack_fffffffffffffe04);
  Matrix4x4::operator*(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
  Matrix4x4::rotation(in_stack_fffffffffffffe08,in_stack_fffffffffffffe04);
  Matrix4x4::operator*(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
  return (Matrix4x4 *)this_00;
}

Assistant:

Matrix4x4 SceneObject::getRotation() {
  Vector3D rot = rotation * M_PI / 180;
  return Matrix4x4::rotation(rot.x, Matrix4x4::Axis::X) *
         Matrix4x4::rotation(rot.y, Matrix4x4::Axis::Y) *
         Matrix4x4::rotation(rot.z, Matrix4x4::Axis::Z);
}